

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseEqn.c
# Opt level: O2

Hop_Obj_t * Parse_ParserPerformTopOp(Hop_Man_t *pMan,Parse_StackFn_t *pStackFn,int Oper)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *p0;
  
  pHVar1 = (Hop_Obj_t *)Parse_StackFnPop(pStackFn);
  p0 = (Hop_Obj_t *)Parse_StackFnPop(pStackFn);
  if (Oper == 7) {
    pHVar1 = Hop_Or(pMan,p0,pHVar1);
  }
  else {
    if (Oper != 9) {
      return (Hop_Obj_t *)0x0;
    }
    pHVar1 = Hop_And(pMan,p0,pHVar1);
  }
  Parse_StackFnPush(pStackFn,pHVar1);
  return pHVar1;
}

Assistant:

Hop_Obj_t * Parse_ParserPerformTopOp( Hop_Man_t * pMan, Parse_StackFn_t * pStackFn, int Oper )
{
    Hop_Obj_t * gArg1, * gArg2, * gFunc;
    // perform the given operation
    gArg2 = (Hop_Obj_t *)Parse_StackFnPop( pStackFn );
    gArg1 = (Hop_Obj_t *)Parse_StackFnPop( pStackFn );
	if ( Oper == PARSE_EQN_OPER_AND )
		gFunc = Hop_And( pMan, gArg1, gArg2 );
	else if ( Oper == PARSE_EQN_OPER_OR )
		gFunc = Hop_Or( pMan, gArg1, gArg2 );
	else
		return NULL;
//    Cudd_Ref( gFunc );
//    Cudd_RecursiveDeref( dd, gArg1 );
//    Cudd_RecursiveDeref( dd, gArg2 );
	Parse_StackFnPush( pStackFn,  gFunc );
    return gFunc;
}